

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O3

bool __thiscall Debugger::GetStacks(Debugger *this,vector<Stack,_std::allocator<Stack>_> *stacks)

{
  pointer *ppIVar1;
  pointer pSVar2;
  Arena<Variable> *pAVar3;
  iterator iVar4;
  vector<Stack,_std::allocator<Stack>_> *pvVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  Variable *pVVar9;
  lua_State *L;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  Idx<Variable> id;
  Idx<Variable> id_00;
  Idx<Variable> variable;
  Idx<Variable> variable_00;
  Idx<Variable> var;
  string local_4c0;
  lua_State *local_4a0;
  vector<Stack,_std::allocator<Stack>_> *local_498;
  ulong local_490;
  vector<Idx<Variable>,std::allocator<Idx<Variable>>> *local_488;
  lua_Debug local_480;
  
  L = this->currentL;
  if (L != (lua_State *)0x0) {
    uVar11 = 0;
    local_4a0 = L;
    local_498 = stacks;
    do {
      memset(&local_480,0,0x450);
      iVar6 = (*lua_getstack)(L,0,&local_480);
      if (iVar6 != 0) {
        iVar6 = 0;
        do {
          iVar7 = (*lua_getinfo)(L,"nSlu",&local_480);
          pvVar5 = local_498;
          if (iVar7 != 0) {
            std::vector<Stack,_std::allocator<Stack>_>::emplace_back<>(local_498);
            pSVar2 = (pvVar5->super__Vector_base<Stack,_std::allocator<Stack>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            GetFile_abi_cxx11_(&local_4c0,this,&local_480);
            std::__cxx11::string::operator=((string *)&pSVar2[-1].file,(string *)&local_4c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_4c0._M_dataplus._M_p._4_4_,(uint)local_4c0._M_dataplus._M_p) !=
                &local_4c0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_4c0._M_dataplus._M_p._4_4_,
                                       (uint)local_4c0._M_dataplus._M_p));
            }
            pcVar8 = getDebugName(&local_480);
            pcVar13 = "";
            if (pcVar8 != (char *)0x0) {
              pcVar13 = getDebugName(&local_480);
            }
            pcVar8 = (char *)pSVar2[-1].functionName._M_string_length;
            strlen(pcVar13);
            std::__cxx11::string::_M_replace
                      ((ulong)&pSVar2[-1].functionName,0,pcVar8,(ulong)pcVar13);
            pSVar2[-1].level = (int)uVar11;
            local_490 = uVar11;
            iVar7 = getDebugCurrentLine(&local_480);
            pSVar2[-1].line = iVar7;
            pcVar8 = (*lua_getlocal)(L,&local_480,1);
            if (pcVar8 != (char *)0x0) {
              iVar7 = 2;
              do {
                if (*pcVar8 == '(') {
                  (*lua_settop)(L,-2);
                }
                else {
                  pAVar3 = pSVar2[-1].variableArena.
                           super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  uVar12 = (int)((ulong)((long)(pAVar3->_data).
                                               super__Vector_base<Variable,_std::allocator<Variable>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pAVar3->_data).
                                              super__Vector_base<Variable,_std::allocator<Variable>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                           0x286bca1b;
                  std::vector<Variable,_std::allocator<Variable>_>::emplace_back<>(&pAVar3->_data);
                  id._4_4_ = 0;
                  id.Raw = uVar12;
                  id._arena = pAVar3;
                  local_4c0._M_dataplus._M_p._0_4_ = uVar12;
                  local_4c0._M_string_length = (size_type)pAVar3;
                  pVVar9 = Arena<Variable>::Index(pAVar3,id);
                  pcVar13 = (char *)(pVVar9->name)._M_string_length;
                  strlen(pcVar8);
                  std::__cxx11::string::_M_replace((ulong)&pVVar9->name,0,pcVar13,(ulong)pcVar8);
                  this->arenaRef =
                       pSVar2[-1].variableArena.
                       super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  variable._4_4_ = 0;
                  variable.Raw = (uint)local_4c0._M_dataplus._M_p;
                  variable._arena = (ArenaClass *)local_4c0._M_string_length;
                  GetVariable(this,L,variable,-1,1,true);
                  this->arenaRef = (Arena<Variable> *)0x0;
                  (*lua_settop)(L,-2);
                  iVar4._M_current =
                       pSVar2[-1].localVariables.
                       super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      pSVar2[-1].localVariables.
                      super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<Idx<Variable>,std::allocator<Idx<Variable>>>::
                    _M_realloc_insert<Idx<Variable>const&>
                              ((vector<Idx<Variable>,std::allocator<Idx<Variable>>> *)
                               &pSVar2[-1].localVariables,iVar4,(Idx<Variable> *)&local_4c0);
                  }
                  else {
                    *(ulong *)iVar4._M_current =
                         CONCAT44(local_4c0._M_dataplus._M_p._4_4_,(uint)local_4c0._M_dataplus._M_p)
                    ;
                    (iVar4._M_current)->_arena = (ArenaClass *)local_4c0._M_string_length;
                    ppIVar1 = &pSVar2[-1].localVariables.
                               super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppIVar1 = *ppIVar1 + 1;
                  }
                }
                pcVar8 = (*lua_getlocal)(L,&local_480,iVar7);
                iVar7 = iVar7 + 1;
              } while (pcVar8 != (char *)0x0);
            }
            iVar7 = (*lua_getinfo)(L,"f",&local_480);
            if (iVar7 != 0) {
              iVar7 = (*lua_gettop)(L);
              pcVar8 = (*lua_getupvalue)(L,iVar7,1);
              if (pcVar8 != (char *)0x0) {
                local_488 = (vector<Idx<Variable>,std::allocator<Idx<Variable>>> *)
                            &pSVar2[-1].upvalueVariables;
                iVar10 = 2;
                do {
                  pAVar3 = pSVar2[-1].variableArena.
                           super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  uVar12 = (int)((ulong)((long)(pAVar3->_data).
                                               super__Vector_base<Variable,_std::allocator<Variable>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pAVar3->_data).
                                              super__Vector_base<Variable,_std::allocator<Variable>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                           0x286bca1b;
                  std::vector<Variable,_std::allocator<Variable>_>::emplace_back<>(&pAVar3->_data);
                  id_00._4_4_ = 0;
                  id_00.Raw = uVar12;
                  id_00._arena = pAVar3;
                  local_4c0._M_dataplus._M_p._0_4_ = uVar12;
                  local_4c0._M_string_length = (size_type)pAVar3;
                  pVVar9 = Arena<Variable>::Index(pAVar3,id_00);
                  pcVar13 = (char *)(pVVar9->name)._M_string_length;
                  strlen(pcVar8);
                  std::__cxx11::string::_M_replace((ulong)&pVVar9->name,0,pcVar13,(ulong)pcVar8);
                  this->arenaRef =
                       pSVar2[-1].variableArena.
                       super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  variable_00._4_4_ = 0;
                  variable_00.Raw = (uint)local_4c0._M_dataplus._M_p;
                  variable_00._arena = (ArenaClass *)local_4c0._M_string_length;
                  GetVariable(this,L,variable_00,-1,1,true);
                  this->arenaRef = (Arena<Variable> *)0x0;
                  (*lua_settop)(L,-2);
                  iVar4._M_current =
                       pSVar2[-1].upvalueVariables.
                       super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      pSVar2[-1].upvalueVariables.
                      super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<Idx<Variable>,std::allocator<Idx<Variable>>>::
                    _M_realloc_insert<Idx<Variable>const&>
                              (local_488,iVar4,(Idx<Variable> *)&local_4c0);
                  }
                  else {
                    *(ulong *)iVar4._M_current =
                         CONCAT44(local_4c0._M_dataplus._M_p._4_4_,(uint)local_4c0._M_dataplus._M_p)
                    ;
                    (iVar4._M_current)->_arena = (ArenaClass *)local_4c0._M_string_length;
                    ppIVar1 = &pSVar2[-1].upvalueVariables.
                               super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppIVar1 = *ppIVar1 + 1;
                  }
                  pcVar8 = (*lua_getupvalue)(L,iVar7,iVar10);
                  iVar10 = iVar10 + 1;
                } while (pcVar8 != (char *)0x0);
              }
              (*lua_settop)(L,-2);
            }
            uVar11 = (ulong)((int)local_490 + 1);
            iVar6 = iVar6 + 1;
          }
          memset(&local_480,0,0x450);
          iVar7 = (*lua_getstack)(L,iVar6,&local_480);
        } while (iVar7 != 0);
      }
      L = ExtensionPoint::QueryParentThread(&this->manager->extension,L);
    } while (L != (lua_State *)0x0);
    this->currentL = local_4a0;
  }
  return false;
}

Assistant:

bool Debugger::GetStacks(std::vector<Stack> &stacks) {
	if (!currentL) {
		return false;
	}

	auto prevCurrentL = currentL;
	auto L = currentL;

	int totalLevel = 0;
	while (true) {
		int level = 0;
		while (true) {
			lua_Debug ar{};
			if (!lua_getstack(L, level, &ar)) {
				break;
			}
			if (!lua_getinfo(L, "nSlu", &ar)) {
				continue;
			}
			// C++ 17 only return T&
			stacks.emplace_back();
			auto &stack = stacks.back();
			stack.file = GetFile(&ar);
			stack.functionName = getDebugName(&ar) == nullptr ? "" : getDebugName(&ar);
			stack.level = totalLevel++;
			stack.line = getDebugCurrentLine(&ar);

			// get variables
			{
				for (int i = 1;; i++) {
					const char *name = lua_getlocal(L, &ar, i);
					if (name == nullptr) {
						break;
					}
					if (name[0] == '(') {
						lua_pop(L, 1);
						continue;
					}

					// add local variable
					auto var = stack.variableArena->Alloc();
					var->name = name;
					SetVariableArena(stack.variableArena.get());
					GetVariable(L, var, -1, 1);
					ClearVariableArenaRef();
					lua_pop(L, 1);
					stack.localVariables.push_back(var);
				}

				if (lua_getinfo(L, "f", &ar)) {
					const int fIdx = lua_gettop(L);
					for (int i = 1;; i++) {
						const char *name = lua_getupvalue(L, fIdx, i);
						if (!name) {
							break;
						}

						// add up variable
						auto var = stack.variableArena->Alloc();
						var->name = name;
						SetVariableArena(stack.variableArena.get());
						GetVariable(L, var, -1, 1);
						ClearVariableArenaRef();
						lua_pop(L, 1);
						stack.upvalueVariables.push_back(var);
					}
					// pop function
					lua_pop(L, 1);
				}
			}

			level++;
		}

		// TODO
		lua_State *PL = manager->extension.QueryParentThread(L);

		if (PL != nullptr) {
			L = PL;
		} else {
			break;
		}
	}

	SetCurrentState(prevCurrentL);

	return false;
}